

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu34x_com.c
# Opt level: O3

RK_S32 vdpu34x_get_rcb_buf_size(Vdpu34xRcbInfo *info,RK_S32 width,RK_S32 height)

{
  RK_S32 buf_size;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar2 = width * 0x16 + 0x3fU & 0xffffffc0;
  info->reg = 0x8b;
  *(undefined8 *)&info->offset = 0x8500000000;
  info->size = uVar2;
  uVar1 = width * 6 + 0x3fU & 0xffffffc0;
  info[1].offset = uVar2;
  info[1].size = uVar1;
  uVar3 = width + 0x3fU & 0xffffffc0;
  info[2].reg = 0x86;
  info[2].offset = uVar2 + uVar1;
  info[2].size = uVar3;
  iVar4 = uVar3 + uVar2 + uVar1;
  uVar2 = width * 3 + 0x3fU & 0xffffffc0;
  info[3].reg = 0x88;
  info[3].offset = iVar4;
  info[3].size = uVar2;
  iVar4 = uVar2 + iVar4;
  info[4].reg = 0x89;
  info[4].offset = iVar4;
  info[4].size = uVar1;
  iVar4 = iVar4 + uVar1;
  info[5].reg = 0x8c;
  info[5].offset = iVar4;
  info[5].size = uVar1;
  iVar4 = iVar4 + uVar1;
  uVar1 = width * 0xb + 0x3fU & 0xffffffc0;
  info[6].reg = 0x8d;
  info[6].offset = iVar4;
  info[6].size = uVar1;
  iVar4 = uVar1 + iVar4;
  uVar1 = height + 0x3fU & 0xffffffc0;
  info[7].reg = 0x87;
  info[7].offset = iVar4;
  info[7].size = uVar1;
  iVar4 = uVar1 + iVar4;
  uVar1 = height * 3 + 0x3fU & 0xffffffc0;
  info[8].reg = 0x8a;
  info[8].offset = iVar4;
  info[8].size = uVar1;
  iVar4 = uVar1 + iVar4;
  uVar1 = height * 0x43 + 0x3fU & 0xffffffc0;
  info[9].reg = 0x8e;
  info[9].offset = iVar4;
  info[9].size = uVar1;
  return uVar1 + iVar4;
}

Assistant:

static RK_S32 update_size_offset(Vdpu34xRcbInfo *info, RK_U32 reg,
                                 RK_S32 offset, RK_S32 len, RK_S32 idx)
{
    RK_S32 buf_size = 0;

    buf_size = MPP_ALIGN(len * rcb_coeff[idx], RCB_ALLINE_SIZE);
    info[idx].reg = reg;
    info[idx].offset = offset;
    info[idx].size = buf_size;

    return buf_size;
}